

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cryptor_test.cpp
# Opt level: O2

void __thiscall WrongMode::test_method(WrongMode *this)

{
  allocator<char> local_113;
  allocator<char> local_112;
  allocator<char> local_111;
  undefined1 local_110 [8];
  undefined1 local_108 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_f8;
  undefined1 local_e8 [32];
  string local_c8 [80];
  char *local_78;
  char *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  char *local_58;
  char *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  char *local_38;
  char *local_30;
  
  local_38 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Dabudabot[P]CifeProject/test/Cryptor_test.cpp"
  ;
  local_30 = "";
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  local_40 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_38,0x2b);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_e8,"WRONG",&local_111);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_108,"Huffman",&local_112);
  std::__cxx11::string::string<std::allocator<char>>(local_c8,"Test message",&local_113);
  Cryptor::cryptor_factory((string *)local_110,(string *)local_e8,(string *)local_108);
  if (local_110 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_110 + 8))();
  }
  local_110 = (undefined1  [8])0x0;
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::~string((string *)local_e8);
  local_58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Dabudabot[P]CifeProject/test/Cryptor_test.cpp"
  ;
  local_50 = "";
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_58,0x2b);
  local_108[0] = (string)0x0;
  local_108._8_8_ = 0;
  aStack_f8._0_8_ = 0;
  local_e8[8] = 0;
  local_e8._0_8_ = &PTR__lazy_ostream_0010eaa8;
  local_e8._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_e8._24_8_ = "exception std::runtime_error expected but not raised";
  local_78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Dabudabot[P]CifeProject/test/Cryptor_test.cpp"
  ;
  local_70 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_f8._M_allocated_capacity);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(WrongMode) {

  BOOST_CHECK_THROW(Cryptor::cryptor_factory(
    "WRONG",
    "Huffman",
    "Test message"
  ), std::runtime_error);
}